

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall enact::Lexer::Lexer(Lexer *this,string *source)

{
  long lVar1;
  undefined1 local_57f;
  undefined1 local_57e;
  undefined1 local_57d;
  TokenType local_57c [31];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_500;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_4d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_4b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_488;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_460;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_438;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_410;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_3e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_3c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_398;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_2f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_2a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_280;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  local_50;
  
  std::__cxx11::string::string((string *)this,(string *)source);
  this->m_current = 0;
  this->m_line = 1;
  this->m_col = 0;
  (this->m_last).lexeme._M_dataplus._M_p = (pointer)&(this->m_last).lexeme.field_2;
  (this->m_last).lexeme._M_string_length = 0;
  (this->m_last).lexeme.field_2._M_local_buf[0] = '\0';
  this->m_currentInterpolations = 0;
  local_57c[0x1e] = 0x27;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(&local_500,(char (*) [4])"and",local_57c + 0x1e)
  ;
  local_57c[0x1d] = 0x28;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(&local_4d8,(char (*) [3])"as",local_57c + 0x1d);
  local_57c[0x1c] = 0x29;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>
            (&local_4b0,(char (*) [6])"assoc",local_57c + 0x1c);
  local_57c[0x1b] = 0x2a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>
            (&local_488,(char (*) [6])"break",local_57c + 0x1b);
  local_57c[0x1a] = 0x2b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>
            (&local_460,(char (*) [5])"case",local_57c + 0x1a);
  local_57c[0x19] = 0x2c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[9],_enact::TokenType,_true>
            (&local_438,(char (*) [9])"continue",local_57c + 0x19);
  local_57c[0x18] = 0x2d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[8],_enact::TokenType,_true>
            (&local_410,(char (*) [8])"default",local_57c + 0x18);
  local_57c[0x17] = 0x2e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>
            (&local_3e8,(char (*) [5])"else",local_57c + 0x17);
  local_57c[0x16] = 0x2f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>
            (&local_3c0,(char (*) [5])"enum",local_57c + 0x16);
  local_57c[0x15] = 0x30;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>
            (&local_398,(char (*) [6])"false",local_57c + 0x15);
  local_57c[0x14] = 0x32;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>
            (&local_370,(char (*) [5])"func",local_57c + 0x14);
  local_57c[0x13] = 0x33;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(&local_348,(char (*) [4])"for",local_57c + 0x13)
  ;
  local_57c[0x12] = 0x31;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>
            (&local_320,(char (*) [3])0x1160ea,local_57c + 0x12);
  local_57c[0x11] = 0x34;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(&local_2f8,(char (*) [3])"if",local_57c + 0x11);
  local_57c[0x10] = 0x35;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(&local_2d0,(char (*) [4])"imm",local_57c + 0x10)
  ;
  local_57c[0xf] = 0x36;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(&local_2a8,(char (*) [5])"impl",local_57c + 0xf)
  ;
  local_57c[0xe] = 0x37;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(&local_280,(char (*) [3])"in",local_57c + 0xe);
  local_57c[0xd] = 0x38;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(&local_258,(char (*) [3])"is",local_57c + 0xd);
  local_57c[0xc] = 0x39;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(&local_230,(char (*) [4])"mut",local_57c + 0xc);
  local_57c[0xb] = 0x3a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(&local_208,(char (*) [4])"not",local_57c + 0xb);
  local_57c[10] = 0x3b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>
            (&local_1e0,(char (*) [3])0x11705f,local_57c + 10);
  local_57c[9] = 0x3c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[4],_enact::TokenType,_true>(&local_1b8,(char (*) [4])"pub",local_57c + 9);
  local_57c[8] = 0x3d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(&local_190,(char (*) [3])"rc",local_57c + 8);
  local_57c[7] = 0x3e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[7],_enact::TokenType,_true>(&local_168,(char (*) [7])"return",local_57c + 7)
  ;
  local_57c[6] = 0x3f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[3],_enact::TokenType,_true>(&local_140,(char (*) [3])"so",local_57c + 6);
  local_57c[5] = 0x40;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[7],_enact::TokenType,_true>(&local_118,(char (*) [7])"struct",local_57c + 5)
  ;
  local_57c[4] = 0x41;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[7],_enact::TokenType,_true>(&local_f0,(char (*) [7])"switch",local_57c + 4);
  local_57c[3] = 0x42;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>(&local_c8,(char (*) [6])"trait",local_57c + 3);
  local_57c[2] = 0x43;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(&local_a0,(char (*) [5])"true",local_57c + 2);
  local_57c[1] = 0x44;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[5],_enact::TokenType,_true>(&local_78,(char (*) [5])"when",local_57c + 1);
  local_57c[0] = WHILE;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_enact::TokenType>
  ::pair<const_char_(&)[6],_enact::TokenType,_true>(&local_50,(char (*) [6])"while",local_57c);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,enact::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,enact::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,enact::TokenType>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,enact::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,enact::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->m_keywords,&local_500,&stack0xffffffffffffffd8,0,&local_57d,&local_57e,
             &local_57f);
  lVar1 = 0x4b0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_500.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  return;
}

Assistant:

Lexer::Lexer(std::string source) : m_source{std::move(source)} {}